

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O1

Result * __thiscall xe::ri::List::allocItem<xe::ri::Result>(List *this)

{
  Result *pRVar1;
  Result *local_18;
  
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve
            (&this->m_items,
             ((long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pRVar1 = (Result *)operator_new(0x30);
  *(undefined8 *)&(pRVar1->super_Item).m_type = 0xe00000000;
  (pRVar1->super_Item)._vptr_Item = (_func_int **)&PTR__Result_0011b838;
  (pRVar1->details)._M_dataplus._M_p = (pointer)&(pRVar1->details).field_2;
  (pRVar1->details)._M_string_length = 0;
  (pRVar1->details).field_2._M_local_buf[0] = '\0';
  local_18 = pRVar1;
  std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::emplace_back<xe::ri::Item*>
            ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)this,(Item **)&local_18);
  return pRVar1;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}